

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_MOVA(Context *ctx)

{
  uint uVar1;
  size_t in_RCX;
  char src0 [64];
  char code [128];
  
  uVar1 = vecsize_from_writemask((ctx->dest_arg).writemask);
  make_GLSL_srcarg_string_masked(ctx,0,src0,in_RCX);
  if (uVar1 == 1) {
    make_GLSL_destarg_assign(ctx,code,0x80,"int(floor(abs(%s) + 0.5) * sign(%s))",src0,src0);
  }
  else {
    make_GLSL_destarg_assign
              (ctx,code,0x80,"ivec%d(floor(abs(%s) + vec%d(0.5)) * sign(%s))",(ulong)uVar1,src0,
               (ulong)uVar1,src0);
  }
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void emit_GLSL_MOVA(Context *ctx)
{
    const int vecsize = vecsize_from_writemask(ctx->dest_arg.writemask);
    char src0[64]; make_GLSL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char code[128];

    if (vecsize == 1)
    {
        make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                 "int(floor(abs(%s) + 0.5) * sign(%s))",
                                 src0, src0);
    } // if

    else
    {
        make_GLSL_destarg_assign(ctx, code, sizeof (code),
                            "ivec%d(floor(abs(%s) + vec%d(0.5)) * sign(%s))",
                            vecsize, src0, vecsize, src0);
    } // else

    output_line(ctx, "%s", code);
}